

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O0

void initAlphabets(bool doAminoAcid,char *resolutionSubset,bool id_map)

{
  int iVar1;
  size_t sVar2;
  byte in_DL;
  char *in_RSI;
  byte in_DIL;
  uchar rcc;
  unsigned_long rc;
  unsigned_long subset_length;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  int i;
  ulong local_38;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  int local_18;
  
  for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
    validFlags[local_18] = -1;
  }
  if ((in_DIL & 1) == 0) {
    if ((in_DL & 1) == 0) {
      for (local_28 = 0; local_28 < 0x12; local_28 = local_28 + 1) {
        validFlags[(byte)"ACGTURYSWKMBDHVN?-"[local_28]] = (char)local_28;
      }
    }
    else {
      for (local_24 = 0; local_24 < 0x12; local_24 = local_24 + 1) {
        validFlags[(byte)"ACGTURYSWKMBDHVN?-"[local_24]] = "ACGTURYSWKMBDHVN?-"[local_24];
      }
    }
    if (in_RSI != (char *)0x0) {
      sVar2 = strlen(in_RSI);
      for (local_38 = 0; local_38 < sVar2; local_38 = local_38 + 1) {
        iVar1 = toupper((int)in_RSI[local_38]);
        if ('\x03' < validFlags[(byte)iVar1]) {
          resolveTheseAmbigs[(byte)validFlags[(byte)iVar1]] = '\x01';
        }
      }
    }
  }
  else if ((in_DL & 1) == 0) {
    for (local_20 = 0; local_20 < 0x19; local_20 = local_20 + 1) {
      validFlags[(byte)"ACDEFGHIKLMNPQRSTVWYBZX?-"[local_20]] = (char)local_20;
    }
  }
  else {
    for (local_1c = 0; local_1c < 0x19; local_1c = local_1c + 1) {
      validFlags[(byte)"ACDEFGHIKLMNPQRSTVWYBZX?-"[local_1c]] =
           "ACDEFGHIKLMNPQRSTVWYBZX?-"[local_1c];
    }
  }
  return;
}

Assistant:

void initAlphabets (bool doAminoAcid, char * resolutionSubset, bool id_map) {
  for (int i = 0; i < 256; i++)
    validFlags [i] = -1;
  
  if (doAminoAcid) {
    if (id_map) {
        for (unsigned int i = 0; i < strlen (ValidCharsAA); i++)
          validFlags [(unsigned char)ValidCharsAA[i]] = (unsigned char)ValidCharsAA[i];
    } else {
        for (unsigned int i = 0; i < strlen (ValidCharsAA); i++)
            validFlags [(unsigned char)ValidCharsAA[i]] = i;

    }
    
    
  } else {  
     if (id_map) {
         for (unsigned int i = 0; i < strlen (ValidChars); i++)
          validFlags [(unsigned char)ValidChars[i]] = (unsigned char)ValidChars[i];
     } else {
         for (unsigned int i = 0; i < strlen (ValidChars); i++)
             validFlags [(unsigned char)ValidChars[i]] = i;
     }
      
    if (resolutionSubset) {
      unsigned long subset_length = strlen (resolutionSubset);
      for (unsigned long rc = 0; rc < subset_length; rc++) {
        unsigned char rcc = toupper( (resolutionSubset[rc]));
        if (validFlags[rcc] > 3) {
          resolveTheseAmbigs[(unsigned char)validFlags[rcc]] = 1;
        }
      }
    }
  }
  
}